

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time-dependency.t.cpp
# Opt level: O3

void __thiscall
dynamicgraph::TimeDependency<int>::addDependencies
          (TimeDependency<int> *this,SignalArray_const<int> *ar)

{
  size_t *psVar1;
  uint in_EAX;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  _List_node_base *p_Var4;
  uint uVar5;
  undefined8 uStack_38;
  
  uStack_38 = (ulong)in_EAX;
  iVar2 = (*ar->_vptr_SignalArray_const[4])(ar);
  if (iVar2 != 0) {
    do {
      iVar2 = (*ar->_vptr_SignalArray_const[3])(ar,(long)&uStack_38 + 4);
      p_Var4 = (_List_node_base *)operator_new(0x18);
      p_Var4[1]._M_next = (_List_node_base *)CONCAT44(extraout_var,iVar2);
      std::__detail::_List_node_base::_M_hook(p_Var4);
      psVar1 = &(this->dependencies).
                super__List_base<const_dynamicgraph::SignalBase<int>_*,_std::allocator<const_dynamicgraph::SignalBase<int>_*>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      uVar5 = uStack_38._4_4_ + 1;
      uStack_38 = CONCAT44(uVar5,(undefined4)uStack_38);
      uVar3 = (*ar->_vptr_SignalArray_const[4])(ar);
    } while (uVar5 < uVar3);
  }
  return;
}

Assistant:

void TimeDependency<Time>::addDependencies(const SignalArray_const<Time> &ar) {
  for (unsigned int i = 0; i < ar.getSize(); ++i) {
    addDependency(ar[i]);
  }
}